

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O1

void intgemm::SSSE3::Kernels8::PrepareBTransposed
               (float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  Index i;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float *local_58 [5];
  float *inputs [4];
  
  auVar1 = _DAT_0010d060;
  if (rows != 0) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      lVar2 = 0;
      do {
        pfVar6 = input + (ulong)uVar4 + (ulong)((uVar5 + (int)lVar2) * cols);
        lVar7 = 0;
        uVar3 = cols - uVar4;
        do {
          for (; uVar3 < 4; uVar3 = uVar3 + cols) {
            pfVar6 = pfVar6 + cols * 7;
          }
          local_58[lVar7] = pfVar6;
          pfVar6 = pfVar6 + 4;
          uVar3 = uVar3 - 4;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        auVar8._0_4_ = (int)(*local_58[0] * quant_mult);
        auVar8._4_4_ = (int)(local_58[0][1] * quant_mult);
        auVar8._8_4_ = (int)(local_58[0][2] * quant_mult);
        auVar8._12_4_ = (int)(local_58[0][3] * quant_mult);
        auVar9._0_4_ = (int)(*local_58[1] * quant_mult);
        auVar9._4_4_ = (int)(local_58[1][1] * quant_mult);
        auVar9._8_4_ = (int)(local_58[1][2] * quant_mult);
        auVar9._12_4_ = (int)(local_58[1][3] * quant_mult);
        auVar8 = packssdw(auVar8,auVar9);
        auVar10._0_4_ = (int)(*local_58[2] * quant_mult);
        auVar10._4_4_ = (int)(local_58[2][1] * quant_mult);
        auVar10._8_4_ = (int)(local_58[2][2] * quant_mult);
        auVar10._12_4_ = (int)(local_58[2][3] * quant_mult);
        auVar11._4_4_ = (int)(local_58[3][1] * quant_mult);
        auVar11._0_4_ = (int)(*local_58[3] * quant_mult);
        auVar11._8_4_ = (int)(local_58[3][2] * quant_mult);
        auVar11._12_4_ = (int)(local_58[3][3] * quant_mult);
        auVar11 = packssdw(auVar10,auVar11);
        auVar11 = packsswb(auVar8,auVar11);
        auVar12[0] = -(auVar1[0] < auVar11[0]);
        auVar12[1] = -(auVar1[1] < auVar11[1]);
        auVar12[2] = -(auVar1[2] < auVar11[2]);
        auVar12[3] = -(auVar1[3] < auVar11[3]);
        auVar12[4] = -(auVar1[4] < auVar11[4]);
        auVar12[5] = -(auVar1[5] < auVar11[5]);
        auVar12[6] = -(auVar1[6] < auVar11[6]);
        auVar12[7] = -(auVar1[7] < auVar11[7]);
        auVar12[8] = -(auVar1[8] < auVar11[8]);
        auVar12[9] = -(auVar1[9] < auVar11[9]);
        auVar12[10] = -(auVar1[10] < auVar11[10]);
        auVar12[0xb] = -(auVar1[0xb] < auVar11[0xb]);
        auVar12[0xc] = -(auVar1[0xc] < auVar11[0xc]);
        auVar12[0xd] = -(auVar1[0xd] < auVar11[0xd]);
        auVar12[0xe] = -(auVar1[0xe] < auVar11[0xe]);
        auVar12[0xf] = -(auVar1[0xf] < auVar11[0xf]);
        *(undefined1 (*) [16])output = ~auVar12 & auVar1 | auVar11 & auVar12;
        output = (int8_t *)((long)output + 0x10);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      for (uVar4 = uVar4 + 0x10; cols <= uVar4; uVar4 = uVar4 - cols) {
        uVar5 = uVar5 + 8;
      }
    } while (uVar5 < rows);
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    SSSE3::SelectColumnsOfB((const __m128i*)input, (__m128i*)output, rows, cols_begin, cols_end);
  }